

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

Literal __thiscall
Clasp::Solver::popVars(Solver *this,uint32 num,bool popLearnt,ConstraintDB *popAux)

{
  size_type *psVar1;
  ConstraintDB *this_00;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_type sVar5;
  pointer pIVar6;
  pointer pLVar7;
  pointer ppCVar8;
  int iVar9;
  undefined4 extraout_var;
  Literal *pLVar10;
  uint32 uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint j;
  uint uVar16;
  long *plVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  LitVec cc;
  
  uVar16 = (this->assign_).assign_.ebo_.size - num;
  uVar2 = uVar16 * 4;
  uVar19 = (this->levels_).super_type.ebo_.size + 1;
  pIVar6 = (this->impliedLits_).lits.ebo_.buf;
  for (lVar12 = 0; (ulong)(this->impliedLits_).lits.ebo_.size * 0x18 - lVar12 != 0;
      lVar12 = lVar12 + 0x18) {
    if ((uVar2 >> 1 <= *(uint *)((long)&(pIVar6->lit).rep_ + lVar12) >> 1) &&
       (uVar22 = *(uint *)((long)&pIVar6->level + lVar12), uVar22 < uVar19)) {
      uVar19 = uVar22;
    }
  }
  uVar16 = uVar16 & 0x3fffffff;
  for (uVar11 = 0; num != uVar11; uVar11 = uVar11 + 1) {
    uVar22 = (this->assign_).assign_.ebo_.buf[uVar16 + uVar11];
    uVar15 = uVar22 >> 4;
    if (uVar19 <= uVar15) {
      uVar15 = uVar19;
    }
    if ((uVar22 & 3) != 0) {
      uVar19 = uVar15;
    }
  }
  uVar22 = (this->levels_).root;
  uVar11 = num;
  if (uVar22 < uVar19) {
    undoUntil(this,uVar19 - 1,2);
  }
  else {
    popRootLevel(this,(uVar22 - uVar19) + 1,(LitVec *)0x0,true);
    if (uVar19 == 0) {
      pLVar7 = (this->assign_).trail.ebo_.buf;
      uVar22 = (this->assign_).units_;
      uVar15 = (this->assign_).front;
      uVar18 = *(uint *)&this->field_0x204 & 0x3fffffff;
      uVar3 = (this->assign_).trail.ebo_.size;
      uVar19 = this->shared_->lastTopLevel_;
      uVar13 = uVar18;
      uVar21 = uVar15;
      uVar20 = uVar22;
      j = uVar19;
      for (; uVar3 != uVar19; uVar19 = uVar19 + 1) {
        uVar4 = pLVar7[uVar19].rep_;
        if (uVar4 >> 1 < uVar2 >> 1) {
          uVar14 = (ulong)j;
          j = j + 1;
          pLVar7[uVar14].rep_ = uVar4;
        }
        else {
          uVar20 = uVar20 - (uVar19 < uVar22);
          uVar21 = uVar21 - (uVar19 < uVar15);
          uVar13 = uVar13 - (uVar19 < uVar18);
        }
      }
      shrinkVecTo<bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>>
                (&(this->assign_).trail,j);
      (this->assign_).front = uVar21;
      (this->assign_).units_ = uVar20;
      *(uint *)&this->field_0x204 = *(uint *)&this->field_0x204 & 0xc0000000 | uVar13 & 0x3fffffff;
    }
  }
  while (uVar11 != 0) {
    bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::clear
              ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
               ((this->watches_).ebo_.buf + ((this->watches_).ebo_.size - 1)),true);
    sVar5 = (this->watches_).ebo_.size;
    (this->watches_).ebo_.size = sVar5 - 1;
    bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::clear
              ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
               ((this->watches_).ebo_.buf + (sVar5 - 2)),true);
    psVar1 = &(this->watches_).ebo_.size;
    *psVar1 = *psVar1 - 1;
    uVar11 = uVar11 - 1;
  }
  if (popLearnt) {
    SharedContext::report(this->shared_,"removing aux constraints",this);
    this_00 = &this->learnts_;
    uVar19 = (this->learnts_).ebo_.size;
    cc.ebo_.buf = (pointer)0x0;
    cc.ebo_.size = 0;
    cc.ebo_.cap = 0;
    uVar14 = 0;
    uVar22 = 0;
    while( true ) {
      ppCVar8 = (this_00->ebo_).buf;
      if (uVar19 == uVar14) break;
      ppCVar8[uVar22] = ppCVar8[uVar14];
      iVar9 = (*(this_00->ebo_).buf[uVar14]->_vptr_Constraint[9])();
      plVar17 = (long *)CONCAT44(extraout_var,iVar9);
      uVar15 = uVar22 + 1;
      if ((plVar17 != (long *)0x0) && (0x3fffffff < *(uint *)(plVar17 + 2))) {
        cc.ebo_._8_8_ = cc.ebo_._8_8_ & 0xffffffff00000000;
        (**(code **)(*plVar17 + 0xa0))(plVar17,&cc);
        pLVar10 = std::
                  __find_if<Clasp::Literal*,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::binder2nd<std::less<Clasp::Literal>>>>>
                            (cc.ebo_.buf,cc.ebo_.buf + (cc.ebo_._8_8_ & 0xffffffff),uVar2);
        if (pLVar10 != cc.ebo_.buf + (cc.ebo_._8_8_ & 0xffffffff)) {
          (**(code **)(*plVar17 + 0x28))(plVar17,this,1);
          uVar15 = uVar22;
        }
      }
      uVar22 = uVar15;
      uVar14 = uVar14 + 1;
    }
    bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::erase
              (this_00,ppCVar8 + uVar22,ppCVar8 + (this->learnts_).ebo_.size);
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::ebo::~ebo(&cc.ebo_);
  }
  if (popAux != (ConstraintDB *)0x0) {
    destroyDB(this,popAux);
  }
  Assignment::resize(&this->assign_,(this->assign_).assign_.ebo_.size - num);
  if ((this->assign_).assign_.ebo_.size - 1 < (this->tag_).rep_ >> 2) {
    (this->tag_).rep_ = 0;
  }
  plVar17 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
  (**(code **)(*plVar17 + 0x30))(plVar17,this,uVar16,num);
  return (Literal)uVar2;
}

Assistant:

Literal Solver::popVars(uint32 num, bool popLearnt, ConstraintDB* popAux) {
	Literal pop = posLit(assign_.numVars() - num);
	uint32  dl  = decisionLevel() + 1;
	for (ImpliedList::iterator it = impliedLits_.begin(); it != impliedLits_.end(); ++it) {
		if (!(it->lit < pop)) { dl = std::min(dl, it->level); }
	}
	for (Var v = pop.var(), end = pop.var()+num; v != end; ++v) {
		if (value(v) != value_free) { dl = std::min(dl, level(v)); }
	}
	// 1. remove aux vars from assignment and watch lists
	if (dl > rootLevel()) {
		undoUntil(dl-1, undo_pop_proj_level);
	}
	else {
		popRootLevel((rootLevel() - dl) + 1);
		if (dl == 0) { // top-level has aux vars - cleanup manually
			uint32 j = shared_->numUnary();
			uint32 nUnits = assign_.units(), nFront = assign_.front, nSimps = lastSimp_;
			for (uint32 i = j, end = sizeVec(assign_.trail), endUnits = nUnits, endFront = nFront, endSimps = lastSimp_; i != end; ++i) {
				if (assign_.trail[i] < pop) { assign_.trail[j++] = assign_.trail[i]; }
				else {
					nUnits -= (i < endUnits);
					nFront -= (i < endFront);
					nSimps -= (i < endSimps);
				}
			}
			shrinkVecTo(assign_.trail, j);
			assign_.front = nFront;
			assign_.setUnits(nUnits);
			lastSimp_ = nSimps;
		}
	}
	for (uint32 n = num; n--;) {
		watches_.back().clear(true);
		watches_.pop_back();
		watches_.back().clear(true);
		watches_.pop_back();
	}
	// 2. remove learnt constraints over aux
	if (popLearnt) {
		shared_->report("removing aux constraints", this);
		ConstraintDB::size_type i, j, end = learnts_.size();
		LitVec cc;
		for (i = j = 0; i != end; ++i) {
			learnts_[j++] = learnts_[i];
			ClauseHead* c = learnts_[i]->clause();
			if (c && c->aux()) {
				cc.clear();
				c->toLits(cc);
				if (std::find_if(cc.begin(), cc.end(), std::not1(std::bind2nd(std::less<Literal>(), pop))) != cc.end()) {
					c->destroy(this, true);
					--j;
				}
			}
		}
		learnts_.erase(learnts_.begin()+j, learnts_.end());
	}
	if (popAux) { destroyDB(*popAux); }
	// 3. remove vars from solver and heuristic
	assign_.resize(assign_.numVars()-num);
	if (!validVar(tag_.var())) { tag_ = lit_true(); }
	heuristic_->updateVar(*this, pop.var(), num);
	return pop;
}